

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O1

void __thiscall
sf::priv::RenderTextureImplFBO::updateTexture(RenderTextureImplFBO *this,uint param_1)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  int iVar3;
  Uint64 UVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  Lock lock;
  
  if ((((this->m_multisample == true) && (this->m_width != 0)) && (this->m_height != 0)) &&
     (iVar3 = (*(this->super_RenderTextureImpl)._vptr_RenderTextureImpl[3])(this,1),
     (char)iVar3 != '\0')) {
    UVar4 = Context::getActiveContextId();
    Lock::Lock(&lock,(Mutex *)&(anonymous_namespace)::mutex);
    p_Var1 = &(this->m_frameBuffers)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = (this->m_frameBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = &p_Var1->_M_header;
    for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < UVar4]) {
      if (*(ulong *)(p_Var5 + 1) >= UVar4) {
        p_Var6 = p_Var5;
      }
    }
    p_Var5 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var5 = p_Var6, UVar4 < *(ulong *)(p_Var6 + 1)))
    {
      p_Var5 = &p_Var1->_M_header;
    }
    p_Var2 = &(this->m_multisampleFrameBuffers)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = (this->m_multisampleFrameBuffers)._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_parent;
    p_Var7 = &p_Var2->_M_header;
    for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < UVar4]) {
      if (*(ulong *)(p_Var6 + 1) >= UVar4) {
        p_Var7 = p_Var6;
      }
    }
    p_Var6 = &p_Var2->_M_header;
    if (((_Rb_tree_header *)p_Var7 != p_Var2) && (p_Var6 = p_Var7, UVar4 < *(ulong *)(p_Var7 + 1)))
    {
      p_Var6 = &p_Var2->_M_header;
    }
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && ((_Rb_tree_header *)p_Var6 != p_Var2)) {
      (*sf_ptrc_glBindFramebufferEXT)(0x8ca9,*(GLuint *)&p_Var5[1]._M_parent);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0x251,"GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, iter->second)");
      (*sf_ptrc_glBlitFramebufferEXT)
                (0,0,this->m_width,this->m_height,0,0,this->m_width,this->m_height,0x4000,0x2600);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0x252,
                   "GLEXT_glBlitFramebuffer(0, 0, m_width, m_height, 0, 0, m_width, m_height, GL_COLOR_BUFFER_BIT, GL_NEAREST)"
                  );
      (*sf_ptrc_glBindFramebufferEXT)(0x8ca9,*(GLuint *)&p_Var6[1]._M_parent);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0x253,
                   "GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, multisampleIter->second)");
    }
    Lock::~Lock(&lock);
  }
  return;
}

Assistant:

void RenderTextureImplFBO::updateTexture(unsigned int)
{
    // If multisampling is enabled, we need to resolve by blitting
    // from our FBO with multisample renderbuffer attachments
    // to our FBO to which our target texture is attached

#ifndef SFML_OPENGL_ES

    // In case of multisampling, make sure both FBOs
    // are already available within the current context
    if (m_multisample && m_width && m_height && activate(true))
    {
        Uint64 contextId = Context::getActiveContextId();

        Lock lock(mutex);

        std::map<Uint64, unsigned int>::iterator iter = m_frameBuffers.find(contextId);
        std::map<Uint64, unsigned int>::iterator multisampleIter = m_multisampleFrameBuffers.find(contextId);

        if ((iter != m_frameBuffers.end()) && (multisampleIter != m_multisampleFrameBuffers.end()))
        {
            // Set up the blit target (draw framebuffer) and blit (from the read framebuffer, our multisample FBO)
            glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, iter->second));
            glCheck(GLEXT_glBlitFramebuffer(0, 0, m_width, m_height, 0, 0, m_width, m_height, GL_COLOR_BUFFER_BIT, GL_NEAREST));
            glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, multisampleIter->second));
        }
    }

#endif // SFML_OPENGL_ES

}